

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::anon_unknown_0::atot<float>(anon_unknown_0 *this,char *s,Parser *parser,float *val)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  long *plVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  allocator<char> local_e9;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  ulong *local_c8;
  long local_c0;
  ulong local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  if ((s == (char *)0x0) || (val == (float *)0x0)) {
    __assert_fail("str && val",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                  ,0x138,"bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = float]");
  }
  local_e8 = (long *)s;
  fVar7 = strtof_l(s,(char **)&local_e8,ClassicLocale::instance_);
  *val = fVar7;
  if (local_e8 == (long *)s) {
    bVar6 = false;
  }
  else {
    bVar6 = (char)*local_e8 == '\0';
  }
  fVar8 = 0.0;
  if (bVar6) {
    if (NAN(fVar7)) {
      fVar8 = NAN;
      goto LAB_00126bee;
    }
  }
  else {
LAB_00126bee:
    *val = fVar8;
  }
  fVar7 = *val;
  if (bVar6) {
    *val = (float)(~-(uint)NAN(fVar7) & (uint)fVar7 | (uint)ABS(fVar7) & -(uint)NAN(fVar7));
    *(undefined2 *)this = 0;
    goto LAB_00127004;
  }
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,s,&local_e9);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x36420d);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_58 = *plVar4;
      lStack_50 = plVar1[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar4;
      local_68 = (long *)*plVar1;
    }
    local_60 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_68);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_98 = *plVar4;
      lStack_90 = plVar1[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar4;
      local_a8 = (long *)*plVar1;
    }
    local_a0 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
    puVar3 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar3) {
      local_b8 = *puVar3;
      lStack_b0 = plVar1[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar3;
      local_c8 = (ulong *)*plVar1;
    }
    local_c0 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    TypeToIntervalString<float>();
    uVar5 = 0xf;
    if (local_c8 != &local_b8) {
      uVar5 = local_b8;
    }
    if (uVar5 < (ulong)(local_80 + local_c0)) {
      uVar5 = 0xf;
      if (local_88 != local_78) {
        uVar5 = local_78[0];
      }
      if (uVar5 < (ulong)(local_80 + local_c0)) goto LAB_00126ee6;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_c8);
    }
    else {
LAB_00126ee6:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_88);
    }
    local_e8 = &local_d8;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_d8 = *plVar1;
      uStack_d0 = puVar2[3];
    }
    else {
      local_d8 = *plVar1;
      local_e8 = (long *)*puVar2;
    }
    local_e0 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)plVar1 = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_88 != local_78) {
      operator_delete(local_88,local_78[0] + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,local_98 + 1);
    }
    if (local_68 != &local_58) {
      operator_delete(local_68,local_58 + 1);
    }
    if (local_48[0] == local_38) goto LAB_00127004;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,s,(allocator<char> *)&local_68);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0x36420d);
    puVar3 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar3) {
      local_b8 = *puVar3;
      lStack_b0 = plVar1[3];
      local_c8 = &local_b8;
    }
    else {
      local_b8 = *puVar3;
      local_c8 = (ulong *)*plVar1;
    }
    local_c0 = plVar1[1];
    *plVar1 = (long)puVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_d8 = *plVar1;
      uStack_d0 = puVar2[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *plVar1;
      local_e8 = (long *)*puVar2;
    }
    local_e0 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    Parser::Error((Parser *)this,(string *)parser);
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8 + 1);
    }
    local_38[0] = local_98;
    local_48[0] = local_a8;
    if (local_a8 == &local_98) goto LAB_00127004;
  }
  operator_delete(local_48[0],local_38[0] + 1);
LAB_00127004:
  return SUB82(this,0);
}

Assistant:

static bool compareFieldDefs(const FieldDef *a, const FieldDef *b) {
  auto a_id = atoi(a->attributes.Lookup("id")->constant.c_str());
  auto b_id = atoi(b->attributes.Lookup("id")->constant.c_str());
  return a_id < b_id;
}